

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

bool __thiscall wallet::LegacyDataSPKM::DeleteRecords(LegacyDataSPKM *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock52;
  WalletBatch local_30;
  unique_lock<std::recursive_mutex> local_20;
  long local_10;
  WalletDatabase *pWVar3;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_20);
  iVar2 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[3])();
  pWVar3 = (WalletDatabase *)CONCAT44(extraout_var,iVar2);
  (*pWVar3->_vptr_WalletDatabase[0xe])(&local_30,pWVar3,1);
  local_30.m_database = pWVar3;
  bVar1 = WalletBatch::EraseRecords
                    (&local_30,
                     (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)DBKeys::LEGACY_TYPES_abi_cxx11_);
  if (local_30.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(long *)local_30.m_batch._M_t.
                          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28
                ))();
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::DeleteRecords()
{
    LOCK(cs_KeyStore);
    WalletBatch batch(m_storage.GetDatabase());
    return batch.EraseRecords(DBKeys::LEGACY_TYPES);
}